

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

int __thiscall QtMWidgets::TableViewCellPrivate::init(TableViewCellPrivate *this,EVP_PKEY_CTX *ctx)

{
  TableViewCell *pTVar1;
  undefined8 uVar2;
  int extraout_EAX;
  QPalette *this_00;
  QColor *pQVar3;
  TableViewCellLayout *this_01;
  MinimumSizeLabel *pMVar4;
  TextLabel *pTVar5;
  QFont *pQVar6;
  QWidget *this_02;
  QFlags<Qt::WindowType> local_8c;
  Int local_88;
  Int local_84;
  undefined1 local_80 [8];
  QTextOption opt_1;
  int local_68;
  int local_64;
  QFont local_60 [8];
  QFont f;
  WindowFlags local_4c;
  Int local_48;
  Int local_44;
  undefined1 local_40 [8];
  QTextOption opt;
  WindowFlags local_24;
  QFlags<Qt::AlignmentFlag> local_20 [4];
  TableViewCellPrivate *local_10;
  TableViewCellPrivate *this_local;
  
  pTVar1 = this->q;
  local_10 = this;
  FingerGeometry::height();
  QWidget::setMinimumHeight((int)pTVar1);
  QWidget::setSizePolicy(&this->q->super_QWidget,Minimum,Fixed);
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  this_00 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(this_00,Highlight);
  uVar2 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->highlightColor = uVar2;
  QColor::setAlpha((int)this + 0x38);
  this_01 = (TableViewCellLayout *)operator_new(0x40);
  TableViewCellLayout::TableViewCellLayout(this_01,&this->q->super_QWidget);
  this->layout = this_01;
  QLayout::setContentsMargins((int)this->layout,3,3,3);
  pMVar4 = (MinimumSizeLabel *)operator_new(0x28);
  MinimumSizeLabel::MinimumSizeLabel(pMVar4,&this->q->super_QWidget);
  this->imageLabel = pMVar4;
  pMVar4 = this->imageLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(local_20,AlignCenter);
  QLabel::setAlignment((QFlags_conflict1 *)pMVar4);
  QLabel::setWordWrap(SUB81(this->imageLabel,0));
  TableViewCellLayout::setImageLabel(this->layout,this->imageLabel);
  pTVar5 = (TextLabel *)operator_new(0x30);
  pTVar1 = this->q;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  TextLabel::TextLabel(pTVar5,&pTVar1->super_QWidget,local_24);
  this->textLabel = pTVar5;
  TextLabel::textOption((TextLabel *)local_40);
  local_48 = (Int)QTextOption::alignment((QTextOption *)local_40);
  local_44 = (Int)Qt::operator|(AlignVCenter,(QFlags<Qt::AlignmentFlag>)local_48);
  QTextOption::setAlignment((QTextOption *)local_40,(Alignment)local_44);
  TextLabel::setTextOption(this->textLabel,(QTextOption *)local_40);
  TableViewCellLayout::setTextLabel(this->layout,this->textLabel);
  QTextOption::~QTextOption((QTextOption *)local_40);
  pTVar5 = (TextLabel *)operator_new(0x30);
  pTVar1 = this->q;
  QFlags<Qt::WindowType>::QFlags(&local_4c);
  TextLabel::TextLabel(pTVar5,&pTVar1->super_QWidget,local_4c);
  this->detailedTextLabel = pTVar5;
  pQVar6 = QWidget::font((QWidget *)this->detailedTextLabel);
  QFont::QFont(local_60,pQVar6);
  local_64 = QFont::pointSize();
  local_64 = local_64 + -1;
  local_68 = 5;
  qMax<int>(&local_64,&local_68);
  QFont::setPointSize((int)local_60);
  TextLabel::setFont(this->detailedTextLabel,local_60);
  TextLabel::textOption((TextLabel *)local_80);
  local_88 = (Int)QTextOption::alignment((QTextOption *)local_80);
  local_84 = (Int)Qt::operator|(AlignVCenter,(QFlags<Qt::AlignmentFlag>)local_88);
  QTextOption::setAlignment((QTextOption *)local_80,(Alignment)local_84);
  TextLabel::setTextOption(this->detailedTextLabel,(QTextOption *)local_80);
  TableViewCellLayout::setDetailedTextLabel(this->layout,this->detailedTextLabel);
  QTextOption::~QTextOption((QTextOption *)local_80);
  QFont::~QFont(local_60);
  this_02 = (QWidget *)operator_new(0x28);
  pTVar1 = this->q;
  QFlags<Qt::WindowType>::QFlags(&local_8c);
  QWidget::QWidget(this_02,&pTVar1->super_QWidget,(QFlags_conflict1 *)(ulong)local_8c.i);
  this->accessoryWidget = this_02;
  TableViewCellLayout::setAccessoryWidget(this->layout,this->accessoryWidget);
  return extraout_EAX;
}

Assistant:

void
TableViewCellPrivate::init()
{
	q->setMinimumHeight( FingerGeometry::height() );
	q->setSizePolicy( QSizePolicy::Minimum, QSizePolicy::Fixed );
	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );

	highlightColor = q->palette().color( QPalette::Highlight );
	highlightColor.setAlpha( 75 );


	layout = new TableViewCellLayout( q );
	layout->setContentsMargins( 3, 3, 3, 3 );

	imageLabel = new MinimumSizeLabel( q );
	imageLabel->setAlignment( Qt::AlignCenter );
	imageLabel->setWordWrap( true );
	layout->setImageLabel( imageLabel );

	{
		textLabel = new TextLabel( q );
		QTextOption opt = textLabel->textOption();
		opt.setAlignment( Qt::AlignVCenter | opt.alignment() );
		textLabel->setTextOption( opt );
		layout->setTextLabel( textLabel );
	}

	{
		detailedTextLabel = new TextLabel( q );
		QFont f = detailedTextLabel->font();
		f.setPointSize( qMax( f.pointSize() - 1, 5 ) );
		detailedTextLabel->setFont( f );
		QTextOption opt = detailedTextLabel->textOption();
		opt.setAlignment( Qt::AlignVCenter | opt.alignment() );
		detailedTextLabel->setTextOption( opt );
		layout->setDetailedTextLabel( detailedTextLabel );
	}

	accessoryWidget = new QWidget( q );
	layout->setAccessoryWidget( accessoryWidget );
}